

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<cv::Mat> *
testing::internal::ActionResultHolder<cv::Mat>::
PerformDefaultAction<cv::Mat(cv::Mat,cv::Rect_<int>)>
          (FunctionMockerBase<cv::Mat_(cv::Mat,_cv::Rect_<int>)> *func_mocker,ArgumentTuple *args,
          string *call_description)

{
  ActionResultHolder<cv::Mat> *this;
  undefined1 local_e0 [192];
  string *local_20;
  string *call_description_local;
  ArgumentTuple *args_local;
  FunctionMockerBase<cv::Mat_(cv::Mat,_cv::Rect_<int>)> *func_mocker_local;
  
  local_20 = call_description;
  call_description_local = (string *)args;
  args_local = (ArgumentTuple *)func_mocker;
  this = (ActionResultHolder<cv::Mat> *)operator_new(0x68);
  FunctionMockerBase<cv::Mat_(cv::Mat,_cv::Rect_<int>)>::PerformDefaultAction
            ((FunctionMockerBase<cv::Mat_(cv::Mat,_cv::Rect_<int>)> *)local_e0,args_local,
             call_description_local);
  ReferenceOrValueWrapper<cv::Mat>::ReferenceOrValueWrapper
            ((ReferenceOrValueWrapper<cv::Mat> *)(local_e0 + 0x60),(Mat *)local_e0);
  ActionResultHolder(this,(Wrapper *)(local_e0 + 0x60));
  ReferenceOrValueWrapper<cv::Mat>::~ReferenceOrValueWrapper
            ((ReferenceOrValueWrapper<cv::Mat> *)(local_e0 + 0x60));
  cv::Mat::~Mat((Mat *)local_e0);
  return this;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMockerBase<F>* func_mocker,
      const typename Function<F>::ArgumentTuple& args,
      const string& call_description) {
    return new ActionResultHolder(Wrapper(
        func_mocker->PerformDefaultAction(args, call_description)));
  }